

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveHyper(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *feastol)

{
  int iVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  pointer pnVar5;
  int *piVar6;
  type_conflict5 tVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  devexpr *pdVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  byte bVar17;
  int local_574;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  devexpr local_330 [112];
  int local_2c0;
  undefined1 local_2bc;
  fpclass_type local_2b8;
  int32_t local_2b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar17 = 0;
  local_538.m_backend.data._M_elems[0x18] = 0;
  local_538.m_backend.data._M_elems[0x19] = 0;
  local_538.m_backend.data._M_elems._104_5_ = 0;
  local_538.m_backend.data._M_elems[0x14] = 0;
  local_538.m_backend.data._M_elems[0x15] = 0;
  local_538.m_backend.data._M_elems[0x16] = 0;
  local_538.m_backend.data._M_elems[0x17] = 0;
  local_538.m_backend.data._M_elems[0x10] = 0;
  local_538.m_backend.data._M_elems[0x11] = 0;
  local_538.m_backend.data._M_elems[0x12] = 0;
  local_538.m_backend.data._M_elems[0x13] = 0;
  local_538.m_backend.data._M_elems[0xc] = 0;
  local_538.m_backend.data._M_elems[0xd] = 0;
  local_538.m_backend.data._M_elems[0xe] = 0;
  local_538.m_backend.data._M_elems[0xf] = 0;
  local_538.m_backend.data._M_elems[8] = 0;
  local_538.m_backend.data._M_elems[9] = 0;
  local_538.m_backend.data._M_elems[10] = 0;
  local_538.m_backend.data._M_elems[0xb] = 0;
  local_538.m_backend.data._M_elems[4] = 0;
  local_538.m_backend.data._M_elems[5] = 0;
  local_538.m_backend.data._M_elems[6] = 0;
  local_538.m_backend.data._M_elems[7] = 0;
  local_538.m_backend.data._M_elems[0] = 0;
  local_538.m_backend.data._M_elems[1] = 0;
  local_538.m_backend.data._M_elems[2] = 0;
  local_538.m_backend.data._M_elems[3] = 0;
  local_538.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_538.m_backend.exp = 0;
  local_538.m_backend.neg = false;
  local_538.m_backend.prec_elem = 0x1c;
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = (pSVar3->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_430,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_3b0,-1,(type *)0x0);
  uVar11 = (ulong)(uint)(this->bestPrices).super_IdxSet.num;
  local_574 = -1;
LAB_00439e43:
  uVar10 = uVar11 & 0xffffffff;
  while( true ) {
    uVar11 = uVar11 - 1;
    if ((int)uVar10 < 1) {
      uVar11 = (ulong)(uint)(((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->updateViols).super_IdxSet.num;
      goto LAB_0043a154;
    }
    iVar1 = (this->bestPrices).super_IdxSet.idx[uVar11];
    lVar9 = 0x1c;
    pnVar12 = pnVar4 + iVar1;
    pnVar14 = &local_538;
    for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_538.m_backend.exp = pnVar4[iVar1].m_backend.exp;
    local_538.m_backend.neg = pnVar4[iVar1].m_backend.neg;
    local_538.m_backend.fpclass = pnVar4[iVar1].m_backend.fpclass;
    local_538.m_backend.prec_elem = pnVar4[iVar1].m_backend.prec_elem;
    pnVar14 = feastol;
    pnVar16 = &result;
    for (; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar7 = boost::multiprecision::operator<(&local_538,&result);
    if (tVar7) break;
    piVar6 = (this->bestPrices).super_IdxSet.idx;
    iVar2 = (this->bestPrices).super_IdxSet.num;
    (this->bestPrices).super_IdxSet.num = iVar2 + -1;
    piVar6[uVar11] = piVar6[(long)iVar2 + -1];
    (((this->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasible).data[iVar1] = 0;
    uVar10 = (ulong)((int)uVar10 - 1);
  }
  lVar9 = 0x1c;
  pnVar14 = &local_538;
  pdVar15 = local_b0;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(uint *)pdVar15 = (pnVar14->m_backend).data._M_elems[0];
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
    pdVar15 = pdVar15 + (ulong)bVar17 * -8 + 4;
  }
  local_40 = local_538.m_backend.exp;
  local_3c = local_538.m_backend.neg;
  local_38 = local_538.m_backend.fpclass;
  iStack_34 = local_538.m_backend.prec_elem;
  pcVar13 = &pnVar5[iVar1].m_backend;
  pnVar14 = &local_130;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = pnVar5[iVar1].m_backend.exp;
  local_130.m_backend.neg = pnVar5[iVar1].m_backend.neg;
  local_130.m_backend.fpclass = pnVar5[iVar1].m_backend.fpclass;
  local_130.m_backend.prec_elem = pnVar5[iVar1].m_backend.prec_elem;
  pnVar14 = feastol;
  pnVar16 = &local_1b0;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = (feastol->m_backend).exp;
  local_1b0.m_backend.neg = (feastol->m_backend).neg;
  local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
  local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
  devexpr::
  computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&result,local_b0,&local_130,&local_1b0,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_b0);
  pnVar14 = &result;
  pnVar16 = &local_538;
  for (; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  local_538.m_backend.exp = result.m_backend.exp;
  local_538.m_backend.neg = result.m_backend.neg;
  local_538.m_backend.fpclass = result.m_backend.fpclass;
  local_538.m_backend.prec_elem = result.m_backend.prec_elem;
  tVar7 = boost::multiprecision::operator>
                    (&local_538,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_430);
  if (tVar7) {
    pnVar14 = &local_538;
    pcVar13 = &local_430;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar13->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_430.exp = local_538.m_backend.exp;
    local_430.neg = local_538.m_backend.neg;
    local_430.fpclass = local_538.m_backend.fpclass;
    local_430.prec_elem = local_538.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this->last).m_backend,&pnVar5[iVar1].m_backend);
    local_574 = iVar1;
  }
  tVar7 = boost::multiprecision::operator<
                    (&local_538,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_3b0);
  if (!tVar7) goto LAB_0043a0d4;
  goto LAB_0043a0f7;
LAB_0043a154:
  uVar10 = uVar11 & 0xffffffff;
  do {
    uVar11 = uVar11 - 1;
    if ((int)uVar10 < 1) {
      return local_574;
    }
    pSVar3 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    iVar1 = (pSVar3->updateViols).super_IdxSet.idx[uVar11];
    if ((pSVar3->isInfeasible).data[iVar1] == 1) {
      lVar9 = 0x1c;
      pnVar12 = pnVar4 + iVar1;
      pnVar14 = &local_538;
      for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + (ulong)bVar17 * -8 + 4);
      }
      local_538.m_backend.exp = pnVar4[iVar1].m_backend.exp;
      local_538.m_backend.neg = pnVar4[iVar1].m_backend.neg;
      local_538.m_backend.fpclass = pnVar4[iVar1].m_backend.fpclass;
      local_538.m_backend.prec_elem = pnVar4[iVar1].m_backend.prec_elem;
      pnVar14 = &local_538;
      pdVar15 = local_330;
      for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(uint *)pdVar15 = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + (ulong)bVar17 * -8 + 4);
        pdVar15 = pdVar15 + (ulong)bVar17 * -8 + 4;
      }
      pcVar13 = &pnVar5[iVar1].m_backend;
      pnVar14 = &local_230;
      for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_230.m_backend.exp = pnVar5[iVar1].m_backend.exp;
      local_230.m_backend.neg = pnVar5[iVar1].m_backend.neg;
      local_230.m_backend.fpclass = pnVar5[iVar1].m_backend.fpclass;
      local_230.m_backend.prec_elem = pnVar5[iVar1].m_backend.prec_elem;
      pnVar14 = feastol;
      pnVar16 = &local_2b0;
      for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = (feastol->m_backend).exp;
      local_2b0.m_backend.neg = (feastol->m_backend).neg;
      local_2b0.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_2b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      local_2c0 = local_538.m_backend.exp;
      local_2bc = local_538.m_backend.neg;
      local_2b8 = local_538.m_backend.fpclass;
      local_2b4 = local_538.m_backend.prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_330,&local_230,&local_2b0,&local_230);
      pnVar14 = &result;
      pnVar16 = &local_538;
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_538.m_backend.exp = result.m_backend.exp;
      local_538.m_backend.neg = result.m_backend.neg;
      local_538.m_backend.fpclass = result.m_backend.fpclass;
      local_538.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar7 = boost::multiprecision::operator>
                        (&local_538,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_3b0);
      if (tVar7) break;
    }
    uVar10 = (ulong)((int)uVar10 - 1);
  } while( true );
  tVar7 = boost::multiprecision::operator>
                    (&local_538,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_430);
  if (tVar7) {
    pnVar14 = &local_538;
    pcVar13 = &local_430;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar13->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + (ulong)bVar17 * -8 + 4);
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_430.exp = local_538.m_backend.exp;
    local_430.neg = local_538.m_backend.neg;
    local_430.fpclass = local_538.m_backend.fpclass;
    local_430.prec_elem = local_538.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this->last).m_backend,&pnVar5[iVar1].m_backend);
    local_574 = iVar1;
  }
  (((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thesolver)->isInfeasible).data[iVar1] = 2;
  DIdxSet::addIdx(&this->bestPrices,iVar1);
  goto LAB_0043a154;
LAB_0043a0d4:
  result.m_backend.data._M_elems[0] = 0;
  tVar7 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_3b0,(int *)&result);
  if (tVar7) {
LAB_0043a0f7:
    pnVar14 = &local_538;
    pcVar13 = &local_3b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar13->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_3b0.exp = local_538.m_backend.exp;
    local_3b0.neg = local_538.m_backend.neg;
    local_3b0.fpclass = local_538.m_backend.fpclass;
    local_3b0.prec_elem = local_538.m_backend.prec_elem;
  }
  goto LAB_00439e43;
}

Assistant:

int SPxDevexPR<R>::selectLeaveHyper(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   R leastBest = -1;
   int bstI = -1;
   int idx = -1;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -feastol);
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bstI = idx;
               last = cpen[idx];
            }

            // put index into candidate list
            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bstI;
}